

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O0

void __thiscall
re2::PrefilterTree::AssignUniqueIds
          (PrefilterTree *this,NodeMap *nodes,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *atom_vec)

{
  bool bVar1;
  Op OVar2;
  int iVar3;
  size_type sVar4;
  reference ppPVar5;
  Prefilter *pPVar6;
  ostream *poVar7;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *pvVar8;
  reference pvVar9;
  reference pvVar10;
  PrefilterTree *this_00;
  reference ppVar11;
  vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>,_bool>
  pVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  vector<int,_std::allocator<int>_> *parents_2;
  int child_id_2;
  pair<unsigned_long,_int> *pair;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_> *__range2;
  double log_num_triggered;
  vector<int,_std::allocator<int>_> *parents_1;
  int child_id_1;
  size_t j_2;
  int id_2;
  Prefilter *prefilter_1;
  int i_5;
  vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  entries_by_num_edges;
  double log_num_regexps;
  Entry *entry;
  int id_1;
  size_t i_4;
  vector<int,_std::allocator<int>_> *parents;
  int child_id;
  size_t j_1;
  int up_count;
  int id;
  Prefilter *prefilter;
  int i_3;
  Prefilter *canonical;
  Prefilter *node;
  int i_2;
  int unique_id;
  size_t j;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *subs;
  Prefilter *f_1;
  size_t i_1;
  Prefilter *f;
  size_t i;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> v;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb48;
  vector<int,_std::allocator<int>_> *this_01;
  iterator in_stack_fffffffffffffb50;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  in_stack_fffffffffffffb58;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  in_stack_fffffffffffffb60;
  size_type in_stack_fffffffffffffb68;
  const_iterator __first;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  Prefilter *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  PrefilterTree *in_stack_fffffffffffffba8;
  int local_424;
  Prefilter *in_stack_fffffffffffffbf0;
  ulong uVar13;
  PrefilterTree *in_stack_fffffffffffffbf8;
  __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
  local_318;
  int *local_310;
  __type_conflict local_308;
  pair<unsigned_long,_int> *local_300;
  pair<unsigned_long,_int> *local_2f8;
  size_type local_2f0;
  vector<int,_std::allocator<int>_> *local_2e8;
  int local_2dc;
  ulong local_2d8;
  int local_2cc;
  Prefilter *local_2c8;
  int local_2bc;
  int local_2b8 [6];
  __type_conflict local_2a0;
  undefined4 local_294;
  reference local_290;
  int local_284;
  ulong local_280;
  vector<int,_std::allocator<int>_> *local_278;
  int local_26c;
  ulong local_268;
  int local_25c;
  LogMessage local_258;
  int local_d4;
  value_type local_d0;
  int local_c4;
  _Base_ptr local_c0;
  undefined1 local_b8;
  string local_b0 [32];
  Prefilter *local_90;
  Prefilter *local_88;
  int local_80;
  int local_7c;
  ulong local_78;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *local_70;
  Prefilter *local_68;
  ulong local_60;
  undefined4 local_44;
  value_type local_40;
  ulong local_38;
  vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> local_30 [2];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x16632c);
  std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::vector
            ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)0x166339);
  for (local_38 = 0; uVar13 = local_38,
      sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size
                        ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)(in_RDI + 2)
                        ), uVar13 < sVar4; local_38 = local_38 + 1) {
    ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                        ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)(in_RDI + 2)
                         ,local_38);
    local_40 = *ppPVar5;
    if (local_40 == (value_type)0x0) {
      local_44 = (undefined4)local_38;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50._M_current,
                 (value_type_conflict2 *)in_stack_fffffffffffffb48);
    }
    std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::push_back
              ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)
               in_stack_fffffffffffffb60._M_current,
               (value_type *)in_stack_fffffffffffffb58._M_current);
  }
  for (local_60 = 0; uVar13 = local_60,
      sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(local_30),
      uVar13 < sVar4; local_60 = local_60 + 1) {
    ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                        (local_30,local_60);
    local_68 = *ppPVar5;
    if ((local_68 != (Prefilter *)0x0) &&
       ((OVar2 = Prefilter::op(local_68), OVar2 == AND ||
        (OVar2 = Prefilter::op(local_68), OVar2 == OR)))) {
      local_70 = Prefilter::subs((Prefilter *)in_stack_fffffffffffffb50._M_current);
      for (local_78 = 0; uVar13 = local_78,
          sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(local_70),
          uVar13 < sVar4; local_78 = local_78 + 1) {
        std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                  (local_70,local_78);
        std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::push_back
                  ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)
                   in_stack_fffffffffffffb60._M_current,
                   (value_type *)in_stack_fffffffffffffb58._M_current);
      }
    }
  }
  local_7c = 0;
  sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(local_30);
  local_80 = (int)sVar4;
  while (local_80 = local_80 + -1, -1 < local_80) {
    ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                        (local_30,(long)local_80);
    local_88 = *ppPVar5;
    if (local_88 != (Prefilter *)0x0) {
      Prefilter::set_unique_id(local_88,-1);
      local_90 = CanonicalNode(in_stack_fffffffffffffba8,
                               (NodeMap *)
                               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                               in_stack_fffffffffffffb98);
      pPVar6 = local_88;
      if (local_90 == (Prefilter *)0x0) {
        NodeString_abi_cxx11_(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        pVar12 = std::
                 map<std::__cxx11::string,re2::Prefilter*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,re2::Prefilter*>>>
                 ::emplace<std::__cxx11::string,re2::Prefilter*&>
                           ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>_>
                             *)in_stack_fffffffffffffb60._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb58._M_current,
                            (Prefilter **)in_stack_fffffffffffffb50._M_current);
        local_c0 = (_Base_ptr)pVar12.first._M_node;
        local_b8 = pVar12.second;
        std::__cxx11::string::~string(local_b0);
        OVar2 = Prefilter::op(local_88);
        if (OVar2 == ATOM) {
          Prefilter::atom_abi_cxx11_(local_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb60._M_current,
                      (value_type *)in_stack_fffffffffffffb58._M_current);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60._M_current,
                     (value_type_conflict2 *)in_stack_fffffffffffffb58._M_current);
        }
        iVar3 = local_7c;
        local_7c = local_7c + 1;
        Prefilter::set_unique_id(local_88,iVar3);
      }
      else {
        iVar3 = Prefilter::unique_id(local_90);
        Prefilter::set_unique_id(pPVar6,iVar3);
      }
    }
  }
  std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::resize
            ((vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(local_30);
  local_c4 = (int)sVar4;
  while (local_c4 = local_c4 + -1, -1 < local_c4) {
    ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                        (local_30,(long)local_c4);
    local_d0 = *ppPVar5;
    if ((local_d0 != (value_type)0x0) &&
       (pPVar6 = CanonicalNode(in_stack_fffffffffffffba8,
                               (NodeMap *)
                               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                               in_stack_fffffffffffffb98), pPVar6 == local_d0)) {
      local_d4 = Prefilter::unique_id(local_d0);
      OVar2 = Prefilter::op(local_d0);
      if (OVar2 == ATOM) {
        pvVar9 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                 ::operator[](in_RDI,(long)local_d4);
        pvVar9->propagate_up_at_count = 1;
      }
      else {
        if (1 < OVar2 - AND) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)in_stack_fffffffffffffb50._M_current,
                     (char *)in_stack_fffffffffffffb48,0);
          poVar7 = LogMessage::stream(&local_258);
          poVar7 = std::operator<<(poVar7,"Unexpected op: ");
          OVar2 = Prefilter::op(local_d0);
          std::ostream::operator<<(poVar7,OVar2);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)in_stack_fffffffffffffb60._M_current)
          ;
        }
        local_25c = 0;
        local_268 = 0;
        while( true ) {
          uVar13 = local_268;
          pvVar8 = Prefilter::subs((Prefilter *)in_stack_fffffffffffffb50._M_current);
          sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(pvVar8);
          if (sVar4 <= uVar13) break;
          pvVar8 = Prefilter::subs((Prefilter *)in_stack_fffffffffffffb50._M_current);
          ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                              (pvVar8,local_268);
          local_26c = Prefilter::unique_id(*ppPVar5);
          pvVar9 = std::
                   vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::
                   operator[](in_RDI,(long)local_26c);
          local_278 = &pvVar9->parents;
          bVar1 = std::vector<int,_std::allocator<int>_>::empty
                            ((vector<int,_std::allocator<int>_> *)
                             in_stack_fffffffffffffb60._M_current);
          if ((bVar1) ||
             (pvVar10 = std::vector<int,_std::allocator<int>_>::back
                                  ((vector<int,_std::allocator<int>_> *)
                                   in_stack_fffffffffffffb50._M_current), *pvVar10 != local_d4)) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb60._M_current,
                       (value_type_conflict2 *)in_stack_fffffffffffffb58._M_current);
            local_25c = local_25c + 1;
          }
          local_268 = local_268 + 1;
        }
        OVar2 = Prefilter::op(local_d0);
        if (OVar2 == AND) {
          local_424 = local_25c;
        }
        else {
          local_424 = 1;
        }
        pvVar9 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                 ::operator[](in_RDI,(long)local_d4);
        pvVar9->propagate_up_at_count = local_424;
      }
    }
  }
  local_280 = 0;
  do {
    uVar13 = local_280;
    sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size
                      ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)(in_RDI + 2));
    if (sVar4 <= uVar13) {
      this_00 = (PrefilterTree *)
                std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size
                          ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)
                           (in_RDI + 2));
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
      local_2a0 = std::log<unsigned_long>(0x166d0b);
      std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
      vector((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
              *)0x166d2f);
      sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(local_30);
      local_2bc = (int)sVar4;
      while (local_2bc = local_2bc + -1, -1 < local_2bc) {
        ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                            (local_30,(long)local_2bc);
        local_2c8 = *ppPVar5;
        if (((local_2c8 != (Prefilter *)0x0) && (OVar2 = Prefilter::op(local_2c8), OVar2 == AND)) &&
           (in_stack_fffffffffffffb98 =
                 CanonicalNode(this_00,(NodeMap *)CONCAT44(3,in_stack_fffffffffffffba0),
                               in_stack_fffffffffffffb98), in_stack_fffffffffffffb98 == local_2c8))
        {
          local_2cc = Prefilter::unique_id(local_2c8);
          std::
          vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
          clear((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                 *)0x166e29);
          local_2d8 = 0;
          while( true ) {
            uVar13 = local_2d8;
            pvVar8 = Prefilter::subs((Prefilter *)in_stack_fffffffffffffb50._M_current);
            sVar4 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::size(pvVar8);
            if (sVar4 <= uVar13) break;
            pvVar8 = Prefilter::subs((Prefilter *)in_stack_fffffffffffffb50._M_current);
            ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                                (pvVar8,local_2d8);
            local_2dc = Prefilter::unique_id(*ppPVar5);
            pvVar9 = std::
                     vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::
                     operator[](in_RDI,(long)local_2dc);
            local_2e8 = &pvVar9->parents;
            local_2f0 = std::vector<int,_std::allocator<int>_>::size(local_2e8);
            std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
            emplace_back<unsigned_long,int&>
                      ((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                        *)in_stack_fffffffffffffb60._M_current,
                       &(in_stack_fffffffffffffb58._M_current)->first,
                       in_stack_fffffffffffffb50._M_current);
            local_2d8 = local_2d8 + 1;
          }
          __first._M_current = local_2b8;
          local_2f8 = (pair<unsigned_long,_int> *)
                      std::
                      vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                      ::begin((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                               *)in_stack_fffffffffffffb48);
          local_300 = (pair<unsigned_long,_int> *)
                      std::
                      vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                      ::end((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                             *)in_stack_fffffffffffffb48);
          std::
          stable_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,int>*,std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>>>
                    (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          local_308 = local_2a0;
          local_310 = local_2b8;
          local_318._M_current =
               (pair<unsigned_long,_int> *)
               std::
               vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
               ::begin((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
                        *)in_stack_fffffffffffffb48);
          std::
          vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
          end((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
               *)in_stack_fffffffffffffb48);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                                     *)in_stack_fffffffffffffb50._M_current,
                                    (__normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                                     *)in_stack_fffffffffffffb48), bVar1) {
            ppVar11 = __gnu_cxx::
                      __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
                      ::operator*(&local_318);
            pvVar9 = std::
                     vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::
                     operator[](in_RDI,(long)ppVar11->second);
            this_01 = &pvVar9->parents;
            if (local_308 <= 0.0) {
              sVar4 = std::vector<int,_std::allocator<int>_>::size(this_01);
              if (9 < sVar4) {
                std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffb48);
                std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffb48);
                in_stack_fffffffffffffb58._M_current =
                     (pair<unsigned_long,_int> *)
                     std::
                     find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                __first._M_current,in_stack_fffffffffffffb60._M_current,
                                in_stack_fffffffffffffb58._M_current);
                std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffb48);
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_fffffffffffffb50._M_current,
                                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_fffffffffffffb48);
                if (bVar1) {
                  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                  __normal_iterator<int*>
                            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)in_stack_fffffffffffffb50._M_current,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             this_01);
                  in_stack_fffffffffffffb50 =
                       std::vector<int,_std::allocator<int>_>::erase
                                 ((vector<int,_std::allocator<int>_> *)
                                  in_stack_fffffffffffffb60._M_current,__first);
                  pvVar9 = std::
                           vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                           ::operator[](in_RDI,(long)local_2cc);
                  pvVar9->propagate_up_at_count = pvVar9->propagate_up_at_count + -1;
                  in_stack_fffffffffffffb48 = this_01;
                }
              }
            }
            else {
              std::vector<int,_std::allocator<int>_>::size(this_01);
              in_stack_fffffffffffffb60._M_current =
                   (pair<unsigned_long,_int> *)std::log<unsigned_long>(0x16703c);
              local_308 = ((double)in_stack_fffffffffffffb60._M_current + local_308) - local_2a0;
            }
            __gnu_cxx::
            __normal_iterator<std::pair<unsigned_long,_int>_*,_std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>_>
            ::operator++(&local_318);
          }
        }
      }
      std::vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>::
      ~vector((vector<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
               *)in_stack_fffffffffffffb60._M_current);
      std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::~vector
                ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)
                 in_stack_fffffffffffffb60._M_current);
      return;
    }
    ppPVar5 = std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                        ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)(in_RDI + 2)
                         ,local_280);
    if (*ppPVar5 != (value_type)0x0) {
      std::vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>::operator[]
                ((vector<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_> *)(in_RDI + 2),
                 local_280);
      pPVar6 = CanonicalNode(in_stack_fffffffffffffba8,
                             (NodeMap *)
                             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             in_stack_fffffffffffffb98);
      local_284 = Prefilter::unique_id(pPVar6);
      if (local_284 < 0) {
        __assert_fail("(0) <= (id)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                      ,0xe7,
                      "void re2::PrefilterTree::AssignUniqueIds(NodeMap *, std::vector<std::string> *)"
                     );
      }
      local_290 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>
                  ::operator[](in_RDI,(long)local_284);
      local_294 = (undefined4)local_280;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb50._M_current,
                 (value_type_conflict2 *)in_stack_fffffffffffffb48);
    }
    local_280 = local_280 + 1;
  } while( true );
}

Assistant:

void PrefilterTree::AssignUniqueIds(NodeMap* nodes,
                                    std::vector<std::string>* atom_vec) {
  atom_vec->clear();

  // Build vector of all filter nodes, sorted topologically
  // from top to bottom in v.
  std::vector<Prefilter*> v;

  // Add the top level nodes of each regexp prefilter.
  for (size_t i = 0; i < prefilter_vec_.size(); i++) {
    Prefilter* f = prefilter_vec_[i];
    if (f == NULL)
      unfiltered_.push_back(static_cast<int>(i));

    // We push NULL also on to v, so that we maintain the
    // mapping of index==regexpid for level=0 prefilter nodes.
    v.push_back(f);
  }

  // Now add all the descendant nodes.
  for (size_t i = 0; i < v.size(); i++) {
    Prefilter* f = v[i];
    if (f == NULL)
      continue;
    if (f->op() == Prefilter::AND || f->op() == Prefilter::OR) {
      const std::vector<Prefilter*>& subs = *f->subs();
      for (size_t j = 0; j < subs.size(); j++)
        v.push_back(subs[j]);
    }
  }

  // Identify unique nodes.
  int unique_id = 0;
  for (int i = static_cast<int>(v.size()) - 1; i >= 0; i--) {
    Prefilter *node = v[i];
    if (node == NULL)
      continue;
    node->set_unique_id(-1);
    Prefilter* canonical = CanonicalNode(nodes, node);
    if (canonical == NULL) {
      // Any further nodes that have the same node string
      // will find this node as the canonical node.
      nodes->emplace(NodeString(node), node);
      if (node->op() == Prefilter::ATOM) {
        atom_vec->push_back(node->atom());
        atom_index_to_id_.push_back(unique_id);
      }
      node->set_unique_id(unique_id++);
    } else {
      node->set_unique_id(canonical->unique_id());
    }
  }
  entries_.resize(unique_id);

  // Fill the entries.
  for (int i = static_cast<int>(v.size()) - 1; i >= 0; i--) {
    Prefilter* prefilter = v[i];
    if (prefilter == NULL)
      continue;
    if (CanonicalNode(nodes, prefilter) != prefilter)
      continue;
    int id = prefilter->unique_id();
    switch (prefilter->op()) {
      default:
        LOG(DFATAL) << "Unexpected op: " << prefilter->op();
        return;

      case Prefilter::ATOM:
        entries_[id].propagate_up_at_count = 1;
        break;

      case Prefilter::OR:
      case Prefilter::AND: {
        // For each child, we append our id to the child's list of
        // parent ids... unless we happen to have done so already.
        // The number of appends is the number of unique children,
        // which allows correct upward propagation from AND nodes.
        int up_count = 0;
        for (size_t j = 0; j < prefilter->subs()->size(); j++) {
          int child_id = (*prefilter->subs())[j]->unique_id();
          std::vector<int>& parents = entries_[child_id].parents;
          if (parents.empty() || parents.back() != id) {
            parents.push_back(id);
            up_count++;
          }
        }
        entries_[id].propagate_up_at_count =
            prefilter->op() == Prefilter::AND ? up_count : 1;
        break;
      }
    }
  }

  // For top level nodes, populate regexp id.
  for (size_t i = 0; i < prefilter_vec_.size(); i++) {
    if (prefilter_vec_[i] == NULL)
      continue;
    int id = CanonicalNode(nodes, prefilter_vec_[i])->unique_id();
    DCHECK_LE(0, id);
    Entry* entry = &entries_[id];
    entry->regexps.push_back(static_cast<int>(i));
  }

  // Lastly, using probability-based heuristics, we identify nodes
  // that trigger too many parents and then we try to prune edges.
  // We use logarithms below to avoid the likelihood of underflow.
  double log_num_regexps = std::log(prefilter_vec_.size() - unfiltered_.size());
  // Hoisted this above the loop so that we don't thrash the heap.
  std::vector<std::pair<size_t, int>> entries_by_num_edges;
  for (int i = static_cast<int>(v.size()) - 1; i >= 0; i--) {
    Prefilter* prefilter = v[i];
    // Pruning applies only to AND nodes because it "just" reduces
    // precision; applied to OR nodes, it would break correctness.
    if (prefilter == NULL || prefilter->op() != Prefilter::AND)
      continue;
    if (CanonicalNode(nodes, prefilter) != prefilter)
      continue;
    int id = prefilter->unique_id();

    // Sort the current node's children by the numbers of parents.
    entries_by_num_edges.clear();
    for (size_t j = 0; j < prefilter->subs()->size(); j++) {
      int child_id = (*prefilter->subs())[j]->unique_id();
      const std::vector<int>& parents = entries_[child_id].parents;
      entries_by_num_edges.emplace_back(parents.size(), child_id);
    }
    std::stable_sort(entries_by_num_edges.begin(), entries_by_num_edges.end());

    // A running estimate of how many regexps will be triggered by
    // pruning the remaining children's edges to the current node.
    // Our nominal target is one, so the threshold is log(1) == 0;
    // pruning occurs iff the child has more than nine edges left.
    double log_num_triggered = log_num_regexps;
    for (const auto& pair : entries_by_num_edges) {
      int child_id = pair.second;
      std::vector<int>& parents = entries_[child_id].parents;
      if (log_num_triggered > 0.) {
        log_num_triggered += std::log(parents.size());
        log_num_triggered -= log_num_regexps;
      } else if (parents.size() > 9) {
        auto it = std::find(parents.begin(), parents.end(), id);
        if (it != parents.end()) {
          parents.erase(it);
          entries_[id].propagate_up_at_count--;
        }
      }
    }
  }
}